

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstWriter.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::SstWriter::DoPutSync(SstWriter *this,Variable<float> *variable,float *values)

{
  PutSyncCommon<float>(this,variable,values);
  return;
}

Assistant:

void SstWriter::PutStructCommon(VariableBase &variable, const void *data)
{
    size_t *Shape = NULL;
    size_t *Start = NULL;
    size_t *Count = NULL;
    size_t DimCount = 0;

    if (m_BetweenStepPairs == false)
    {
        helper::Throw<std::logic_error>("Engine", "SstWriter", "PutSyncCommon",
                                        "When using the SST engine in ADIOS2, "
                                        "Put() calls must appear between "
                                        "BeginStep/EndStep pairs");
    }

    if (Params.MarshalMethod != SstMarshalBP5)
    {
        helper::Throw<std::logic_error>(
            "Engine", "SstWriter", "PutStructCommon",
            "Support for struct types only exists when using BP5 marshalling");
    }

    if (variable.m_ShapeID == ShapeID::GlobalArray)
    {
        DimCount = variable.m_Shape.size();
        Shape = variable.m_Shape.data();
        Start = variable.m_Start.data();
        Count = variable.m_Count.data();
    }
    else if (variable.m_ShapeID == ShapeID::LocalArray)
    {
        DimCount = variable.m_Count.size();
        Count = variable.m_Count.data();
    }
    m_BP5Serializer->Marshal((void *)&variable, variable.m_Name.c_str(), variable.m_Type,
                             variable.m_ElementSize, DimCount, Shape, Count, Start, data, true,
                             nullptr);
}